

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRItemFactory.h
# Opt level: O3

VRInputDevice * __thiscall
MinVR::VRSpecificItemFactory<MinVR::VRInputDevice>::create
          (VRSpecificItemFactory<MinVR::VRInputDevice> *this,VRMainInterface *vrMain,
          VRDataIndex *config,string *dataContainer)

{
  int iVar1;
  VRInputDevice *pVVar2;
  string type;
  string attributeName;
  string local_68;
  string local_48;
  undefined4 extraout_var;
  
  local_48.field_2._M_allocated_capacity._0_7_ = 0x65647475706e69;
  local_48.field_2._M_local_buf[7] = 'v';
  local_48.field_2._8_7_ = 0x65707954656369;
  local_48._M_string_length = 0xf;
  local_48.field_2._M_local_buf[0xf] = '\0';
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  VRDataIndex::getAttributeValue(&local_68,config,dataContainer,&local_48);
  if (local_68._M_string_length == (this->_typeName)._M_string_length) {
    if (local_68._M_string_length != 0) {
      iVar1 = bcmp(local_68._M_dataplus._M_p,(this->_typeName)._M_dataplus._M_p,
                   local_68._M_string_length);
      if (iVar1 != 0) goto LAB_00124ae9;
    }
    iVar1 = (*(this->super_VRItemFactory)._vptr_VRItemFactory[4])(this,vrMain,config,dataContainer);
    pVVar2 = (VRInputDevice *)CONCAT44(extraout_var,iVar1);
  }
  else {
LAB_00124ae9:
    pVVar2 = (VRInputDevice *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,
                    CONCAT17(local_48.field_2._M_local_buf[7],
                             local_48.field_2._M_allocated_capacity._0_7_) + 1);
  }
  return pVVar2;
}

Assistant:

virtual T* create(VRMainInterface *vrMain, VRDataIndex *config, const std::string &dataContainer) {
		std::string attributeName = T::getAttributeName();

		std::string type = config->getAttributeValue(dataContainer, attributeName);

		if (type != _typeName) {
			// This factory cannot create the type specified
			return NULL;
		}

		return createConcrete(vrMain, config, dataContainer);
	}